

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall IlmThread_2_5::TaskGroup::Data::addTask(Data *this)

{
  __int_type _Var1;
  void *__stat_loc;
  __atomic_base<int> *in_RDI;
  
  __stat_loc = (void *)0x0;
  _Var1 = std::__atomic_base<int>::operator++(in_RDI,0);
  if (_Var1 == 0) {
    Semaphore::wait((Semaphore *)(in_RDI + 2),__stat_loc);
  }
  return;
}

Assistant:

void
TaskGroup::Data::addTask () 
{
    //
    // in c++11, we use an atomic to protect numPending to avoid the
    // extra lock but for c++98, to add the ability for custom thread
    // pool we add the lock here
    //
#ifdef ILMBASE_FORCE_CXX03
    Lock lock (dtorMutex);
#endif
    if (numPending++ == 0)
        isEmpty.wait ();
}